

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O1

BasicBlock * __thiscall
spvtools::opt::Loop::FindLoopPreheader(Loop *this,DominatorAnalysis *dom_analysis)

{
  _Rb_tree_header *p_Var1;
  DominatorTreeNode *b;
  uint uVar2;
  IRContext *this_00;
  CFG *this_01;
  Instruction *pIVar3;
  bool bVar4;
  _Rb_tree_color _Var5;
  uint32_t blk_id;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  _Rb_tree_header *p_Var8;
  BasicBlock *pBVar9;
  DominatorTree *this_02;
  pointer puVar10;
  bool bVar11;
  bool bVar12;
  bool is_preheader;
  vector<unsigned_int,_std::allocator<unsigned_int>_> header_pred;
  char local_91;
  BasicBlock *local_90;
  DominatorTree *local_88;
  Loop *local_80;
  DominatorTreeNode *local_78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_70;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  this_00 = this->context_;
  local_88 = (DominatorTree *)dom_analysis;
  if ((this_00->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
    IRContext::BuildCFG(this_00);
  }
  this_01 = (this_00->cfg_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>._M_t
            .super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>.
            super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl;
  pIVar3 = (this->loop_header_->label_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  _Var5 = _S_red;
  if (pIVar3->has_result_id_ == true) {
    _Var5 = Instruction::GetSingleWordOperand(pIVar3,(uint)pIVar3->has_type_id_);
  }
  p_Var1 = &(local_88->nodes_)._M_t._M_impl.super__Rb_tree_header;
  p_Var7 = (local_88->nodes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var6 = &p_Var1->_M_header;
  for (; p_Var7 != (_Base_ptr)0x0; p_Var7 = (&p_Var7->_M_left)[bVar11]) {
    bVar11 = p_Var7[1]._M_color < _Var5;
    if (!bVar11) {
      p_Var6 = p_Var7;
    }
  }
  p_Var7 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var6 != p_Var1) && (p_Var7 = p_Var6, _Var5 < p_Var6[1]._M_color)) {
    p_Var7 = &p_Var1->_M_header;
  }
  blk_id = 0;
  local_78 = (DominatorTreeNode *)0x0;
  if ((_Rb_tree_header *)p_Var7 != p_Var1) {
    local_78 = (DominatorTreeNode *)&p_Var7[1]._M_parent;
  }
  pIVar3 = (this->loop_header_->label_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  local_80 = this;
  if (pIVar3->has_result_id_ == true) {
    blk_id = Instruction::GetSingleWordOperand(pIVar3,(uint)pIVar3->has_type_id_);
  }
  __x = CFG::preds(this_01,blk_id);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_70,__x);
  bVar11 = local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start ==
           local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (bVar11) {
    local_90 = (BasicBlock *)0x0;
  }
  else {
    local_90 = (BasicBlock *)0x0;
    this_02 = local_88;
    puVar10 = local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      uVar2 = *puVar10;
      p_Var7 = (this_02->nodes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var6 = &p_Var1->_M_header;
      for (; (_Rb_tree_header *)p_Var7 != (_Rb_tree_header *)0x0;
          p_Var7 = (&p_Var7->_M_left)[bVar12]) {
        bVar12 = (uint)*(size_t *)(p_Var7 + 1) < uVar2;
        if (!bVar12) {
          p_Var6 = p_Var7;
        }
      }
      p_Var8 = p_Var1;
      if (((_Rb_tree_header *)p_Var6 != p_Var1) &&
         (p_Var8 = (_Rb_tree_header *)p_Var6,
         uVar2 < (uint)((_Rb_tree_header *)p_Var6)->_M_node_count)) {
        p_Var8 = p_Var1;
      }
      b = (DominatorTreeNode *)(p_Var8 + 1);
      bVar12 = true;
      if ((p_Var8 != p_Var1) &&
         (bVar4 = DominatorTree::Dominates(this_02,local_78,b), this_02 = local_88, !bVar4)) {
        if ((local_90 == (BasicBlock *)0x0) || (b->bb_ == local_90)) {
          local_90 = b->bb_;
        }
        else {
          bVar12 = false;
        }
      }
      if (!bVar12) break;
      puVar10 = puVar10 + 1;
      bVar11 = puVar10 ==
               local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    } while (!bVar11);
  }
  if (bVar11) {
    if (local_90 == (BasicBlock *)0x0) {
      __assert_fail("loop_pred && \"The header node is the entry block ?\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_descriptor.cpp"
                    ,0xf3,"BasicBlock *spvtools::opt::Loop::FindLoopPreheader(DominatorAnalysis *)")
      ;
    }
    local_91 = '\x01';
    pIVar3 = (local_80->loop_header_->label_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    local_58._8_4_ = 0;
    if (pIVar3->has_result_id_ == true) {
      local_58._8_4_ = Instruction::GetSingleWordOperand(pIVar3,(uint)pIVar3->has_type_id_);
    }
    local_58._M_unused._M_object = &local_91;
    local_58._12_4_ = 0;
    pcStack_40 = std::
                 _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_descriptor.cpp:252:7)>
                 ::_M_invoke;
    local_48 = std::
               _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_descriptor.cpp:252:7)>
               ::_M_manager;
    BasicBlock::ForEachSuccessorLabel(local_90,(function<void_(unsigned_int)> *)&local_58);
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
    pBVar9 = (BasicBlock *)0x0;
    if (local_91 != '\0') {
      pBVar9 = local_90;
    }
  }
  else {
    pBVar9 = (BasicBlock *)0x0;
  }
  if (local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return pBVar9;
}

Assistant:

BasicBlock* Loop::FindLoopPreheader(DominatorAnalysis* dom_analysis) {
  CFG* cfg = context_->cfg();
  DominatorTree& dom_tree = dom_analysis->GetDomTree();
  DominatorTreeNode* header_node = dom_tree.GetTreeNode(loop_header_);

  // The loop predecessor.
  BasicBlock* loop_pred = nullptr;

  auto header_pred = cfg->preds(loop_header_->id());
  for (uint32_t p_id : header_pred) {
    DominatorTreeNode* node = dom_tree.GetTreeNode(p_id);
    if (node && !dom_tree.Dominates(header_node, node)) {
      // The predecessor is not part of the loop, so potential loop preheader.
      if (loop_pred && node->bb_ != loop_pred) {
        // If we saw 2 distinct predecessors that are outside the loop, we don't
        // have a loop preheader.
        return nullptr;
      }
      loop_pred = node->bb_;
    }
  }
  // Safe guard against invalid code, SPIR-V spec forbids loop with the entry
  // node as header.
  assert(loop_pred && "The header node is the entry block ?");

  // So we have a unique basic block that can enter this loop.
  // If this loop is the unique successor of this block, then it is a loop
  // preheader.
  bool is_preheader = true;
  uint32_t loop_header_id = loop_header_->id();
  const auto* const_loop_pred = loop_pred;
  const_loop_pred->ForEachSuccessorLabel(
      [&is_preheader, loop_header_id](const uint32_t id) {
        if (id != loop_header_id) is_preheader = false;
      });
  if (is_preheader) return loop_pred;
  return nullptr;
}